

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_create_collation16
              (sqlite3 *db,void *zName,int enc,void *pCtx,
              _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare)

{
  uint uVar1;
  char *zName_00;
  void *pvVar2;
  
  pvVar2 = pCtx;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  zName_00 = sqlite3Utf16to8(db,zName,-1,(u8)pvVar2);
  if (zName_00 == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = createCollation(db,zName_00,(u8)enc,pCtx,xCompare,(_func_void_void_ptr *)0x0);
    sqlite3DbFreeNN(db,zName_00);
  }
  if (db->mallocFailed == '\0') {
    uVar1 = uVar1 & db->errMask;
  }
  else {
    apiOomError(db);
    uVar1 = 7;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_create_collation16(
  sqlite3* db, 
  const void *zName,
  int enc, 
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*)
){
  int rc = SQLITE_OK;
  char *zName8;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zName==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  zName8 = sqlite3Utf16to8(db, zName, -1, SQLITE_UTF16NATIVE);
  if( zName8 ){
    rc = createCollation(db, zName8, (u8)enc, pCtx, xCompare, 0);
    sqlite3DbFree(db, zName8);
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}